

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glucose.cpp
# Opt level: O3

void __thiscall Gluco::Solver::cancelUntil(Solver *this,int level)

{
  int *piVar1;
  int iVar2;
  char *__function;
  int iVar3;
  long lVar4;
  
  if ((this->trail_lim).sz <= level) {
    return;
  }
  iVar3 = (this->trail).sz;
  lVar4 = (long)iVar3;
  piVar1 = (this->trail_lim).data;
  iVar2 = piVar1[level];
  if (iVar2 < iVar3) {
    do {
      lVar4 = lVar4 + -1;
      iVar3 = (this->trail).data[lVar4].x >> 1;
      (this->assigns).data[iVar3].value = '\x02';
      if ((1 < this->phase_saving) ||
         ((this->phase_saving == 1 &&
          ((this->trail_lim).data[(long)(this->trail_lim).sz + -1] < lVar4)))) {
        (this->polarity).data[iVar3] = (byte)(this->trail).data[lVar4].x & 1;
      }
      if ((((this->order_heap).indices.sz <= iVar3) || ((this->order_heap).indices.data[iVar3] < 0))
         && ((this->decision).data[iVar3] != '\0')) {
        Heap<Gluco::Solver::VarOrderLt>::insert(&this->order_heap,iVar3);
      }
      piVar1 = (this->trail_lim).data;
      iVar2 = piVar1[level];
    } while (iVar2 < lVar4);
  }
  this->qhead = iVar2;
  iVar3 = piVar1[level];
  if (iVar3 < 0) {
    __function = "void Gluco::vec<Gluco::Lit>::shrink(int) [T = Gluco::Lit]";
  }
  else {
    if (iVar3 < (this->trail).sz) {
      (this->trail).sz = iVar3;
    }
    if (-1 < level) {
      if ((this->trail_lim).sz <= level) {
        return;
      }
      (this->trail_lim).sz = level;
      return;
    }
    __function = "void Gluco::vec<int>::shrink(int) [T = int]";
  }
  __assert_fail("nelems <= sz",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/glucose/Vec.h"
                ,0x42,__function);
}

Assistant:

void Solver::cancelUntil(int level) {
    if (decisionLevel() > level){
        for (int c = trail.size()-1; c >= trail_lim[level]; c--){
            Var      x  = var(trail[c]);
            assigns [x] = l_Undef;
            if (phase_saving > 1 || ((phase_saving == 1) && c > trail_lim.last()))
                polarity[x] = sign(trail[c]);
            insertVarOrder(x); }
        qhead = trail_lim[level];
        trail.shrink(trail.size() - trail_lim[level]);
        trail_lim.shrink(trail_lim.size() - level);
    } 
}